

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

void __thiscall wasm::SIMDReplace::finalize(SIMDReplace *this)

{
  Expression *pEVar1;
  Expression *pEVar2;
  
  pEVar1 = this->vec;
  if ((pEVar1 != (Expression *)0x0) && (pEVar2 = this->value, pEVar2 != (Expression *)0x0)) {
    (this->super_SpecificExpression<(wasm::Expression::Id)30>).super_Expression.type.id = 6;
    if (((pEVar1->type).id == 1) || ((pEVar2->type).id == 1)) {
      (this->super_SpecificExpression<(wasm::Expression::Id)30>).super_Expression.type.id = 1;
    }
    return;
  }
  __assert_fail("vec && value",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm.cpp"
                ,0x192,"void wasm::SIMDReplace::finalize()");
}

Assistant:

void SIMDReplace::finalize() {
  assert(vec && value);
  type = Type::v128;
  if (vec->type == Type::unreachable || value->type == Type::unreachable) {
    type = Type::unreachable;
  }
}